

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

int32_t __thiscall wasm::WasmBinaryReader::getS32LEB(WasmBinaryReader *this)

{
  size_t in_RCX;
  void *__buf;
  anon_class_8_1_8991fb9c local_40;
  function<signed_char_()> local_38;
  LEB<int,_signed_char> local_14;
  WasmBinaryReader *pWStack_10;
  S32LEB ret;
  WasmBinaryReader *this_local;
  
  local_40.this = this;
  pWStack_10 = this;
  std::function<signed_char()>::function<wasm::WasmBinaryReader::getS32LEB()::__0,void>
            ((function<signed_char()> *)&local_38,&local_40);
  LEB<int,_signed_char>::read(&local_14,(int)&local_38,__buf,in_RCX);
  std::function<signed_char_()>::~function(&local_38);
  return local_14.value;
}

Assistant:

int32_t WasmBinaryReader::getS32LEB() {
  S32LEB ret;
  ret.read([&]() { return (int8_t)getInt8(); });
  return ret.value;
}